

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O0

Position __thiscall indk::operator/(indk *this,Position *P,float D)

{
  uint uVar1;
  uint uVar2;
  float *extraout_RDX;
  Position PVar3;
  vector<float,_std::allocator<float>_> local_68;
  float local_40;
  uint local_3c;
  undefined1 local_38 [4];
  uint i;
  vector<float,_std::allocator<float>_> PV;
  float D_local;
  Position *P_local;
  
  PV.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = D;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_38);
  local_3c = 0;
  while( true ) {
    uVar2 = local_3c;
    uVar1 = Position::getDimensionsCount(P);
    if (uVar1 <= uVar2) break;
    local_40 = Position::getPositionValue(P,local_3c);
    local_40 = local_40 /
               PV.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage._4_4_;
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)local_38,&local_40);
    local_3c = local_3c + 1;
  }
  uVar2 = Position::getXm(P);
  std::vector<float,_std::allocator<float>_>::vector
            (&local_68,(vector<float,_std::allocator<float>_> *)local_38);
  Position::Position((Position *)this,uVar2,&local_68);
  std::vector<float,_std::allocator<float>_>::~vector(&local_68);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_38);
  PVar3.X = extraout_RDX;
  PVar3._0_8_ = this;
  return PVar3;
}

Assistant:

indk::Position indk::operator/(const indk::Position &P, float D) {
    std::vector<float> PV;
    for (unsigned int i = 0; i < P.getDimensionsCount(); i++) {
        PV.push_back(P.getPositionValue(i)/D);
    }
    return indk::Position(P.getXm(), PV);
}